

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O1

void Eigen::internal::
     call_restricted_packet_assignment_no_alias<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>,Eigen::Matrix<float,_1,_1,0,_1,_1>,1>,Eigen::internal::assign_op<float,float>>
               (Matrix<float,__1,__1,_0,__1,__1> *dst,
               Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1>
               *src,assign_op<float,_float> *func)

{
  long lVar1;
  Index row;
  long row_00;
  float *pfVar2;
  Index col;
  long col_00;
  CoeffReturnType CVar3;
  SrcEvaluatorType srcEvaluator;
  product_evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  local_78;
  
  Matrix<float,-1,-1,1,-1,-1>::
  Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>>
            ((Matrix<float,_1,_1,1,_1,_1> *)&local_78,&src->m_lhs);
  local_78.m_rhs = src->m_rhs;
  local_78.m_lhsImpl.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>_>.m_d.data =
       local_78.m_lhs.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>.m_storage.
       m_data;
  local_78.m_lhsImpl.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>_>.m_d.
  m_outerStride =
       local_78.m_lhs.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>.m_storage.
       m_cols;
  local_78.m_rhsImpl.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_d.data =
       ((local_78.m_rhs)->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage
       .m_data;
  local_78.m_rhsImpl.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_d.
  m_outerStride =
       ((local_78.m_rhs)->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage
       .m_rows;
  local_78.m_innerDim =
       (((src->m_lhs).m_rhs.m_diagonal)->
       super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  resize_if_allowed<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>,Eigen::Matrix<float,_1,_1,0,_1,_1>,1>,float,float>
            (dst,src,func);
  if (0 < (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols) {
    pfVar2 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_data
    ;
    lVar1 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    col_00 = 0;
    do {
      if (0 < (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows) {
        row_00 = 0;
        do {
          CVar3 = product_evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
                  ::coeff(&local_78,row_00,col_00);
          pfVar2[row_00] = CVar3;
          row_00 = row_00 + 1;
        } while (row_00 < (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
                          m_storage.m_rows);
      }
      col_00 = col_00 + 1;
      pfVar2 = pfVar2 + lVar1;
    } while (col_00 < (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
                      m_storage.m_cols);
  }
  free(local_78.m_lhs.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>.m_storage.
       m_data);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_restricted_packet_assignment_no_alias(Dst& dst, const Src& src, const Func& func)
{
    typedef evaluator<Dst> DstEvaluatorType;
    typedef evaluator<Src> SrcEvaluatorType;
    typedef restricted_packet_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Func> Kernel;

    EIGEN_STATIC_ASSERT_LVALUE(Dst)
    EIGEN_CHECK_BINARY_COMPATIBILIY(Func,typename Dst::Scalar,typename Src::Scalar);

    SrcEvaluatorType srcEvaluator(src);
    resize_if_allowed(dst, src, func);

    DstEvaluatorType dstEvaluator(dst);
    Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

    dense_assignment_loop<Kernel>::run(kernel);
}